

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map_test.cc
# Opt level: O3

void __thiscall bloaty::RangeMapTest_Bug1_Test::RangeMapTest_Bug1_Test(RangeMapTest_Bug1_Test *this)

{
  _Rb_tree_header *p_Var1;
  
  testing::Test::Test((Test *)this);
  p_Var1 = &(this->super_RangeMapTest).map_.mappings_._M_t._M_impl.super__Rb_tree_header;
  (this->super_RangeMapTest).map_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  *(_Base_ptr *)
   ((long)&(this->super_RangeMapTest).map_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header +
   8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->super_RangeMapTest).map_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header +
   0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->super_RangeMapTest).map_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header +
   0x18) = p_Var1;
  (this->super_RangeMapTest).map_.mappings_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->super_RangeMapTest).map2_.mappings_._M_t._M_impl.super__Rb_tree_header;
  (this->super_RangeMapTest).map2_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  *(_Base_ptr *)
   ((long)&(this->super_RangeMapTest).map2_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header +
   8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->super_RangeMapTest).map2_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header +
   0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->super_RangeMapTest).map2_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header +
   0x18) = p_Var1;
  (this->super_RangeMapTest).map2_.mappings_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->super_RangeMapTest).map3_.mappings_._M_t._M_impl.super__Rb_tree_header;
  (this->super_RangeMapTest).map3_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  *(_Base_ptr *)
   ((long)&(this->super_RangeMapTest).map3_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header +
   8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->super_RangeMapTest).map3_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header +
   0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->super_RangeMapTest).map3_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header +
   0x18) = p_Var1;
  (this->super_RangeMapTest).map3_.mappings_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined4 *)&(this->super_RangeMapTest).kNoTranslation = 0xffffffff;
  *(undefined4 *)((long)&(this->super_RangeMapTest).kNoTranslation + 4) = 0xffffffff;
  *(undefined4 *)&(this->super_RangeMapTest).kUnknownSize = 0xffffffff;
  *(undefined4 *)((long)&(this->super_RangeMapTest).kUnknownSize + 4) = 0xffffffff;
  (this->super_RangeMapTest).super_Test._vptr_Test = (_func_int **)&PTR__RangeMapTest_0061da28;
  return;
}

Assistant:

TEST_F(RangeMapTest, Bug1) {
  map_.AddRange(100, 20, "foo");
  map_.AddRange(120, 20, "bar");
  map_.AddRange(100, 15, "baz");
  AssertMainMapEquals({
    {100, 120, kNoTranslation, "foo"},
    {120, 140, kNoTranslation, "bar"},
  });
}